

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v11::detail::do_format_decimal<char,unsigned_long>
                 (char *out,unsigned_long value,int size)

{
  int iVar1;
  char *pcVar2;
  undefined2 *puVar3;
  int in_EDX;
  ulong in_RSI;
  long in_RDI;
  uint n;
  make_unsigned_t<int> local_3c;
  bool local_35 [5];
  ulong local_30;
  long local_28;
  ulong local_20;
  undefined2 *local_18;
  ulong local_10;
  undefined2 *local_8;
  
  local_30 = in_RSI;
  local_28 = in_RDI;
  iVar1 = count_digits(0x252d04);
  local_35[0] = iVar1 <= in_EDX;
  ignore_unused<bool,char[20]>(local_35,(char (*) [20])"invalid digit count");
  local_3c = to_unsigned<int>(0);
  for (; 99 < local_30; local_30 = local_30 / 100) {
    local_3c = local_3c - 2;
    puVar3 = (undefined2 *)(local_28 + (ulong)local_3c);
    local_10 = local_30 % 100;
    local_8 = puVar3;
    pcVar2 = digits2(local_10);
    *puVar3 = *(undefined2 *)pcVar2;
  }
  if (local_30 < 10) {
    local_3c = local_3c - 1;
    *(char *)(local_28 + (ulong)local_3c) = (char)local_30 + '0';
  }
  else {
    local_3c = local_3c - 2;
    puVar3 = (undefined2 *)(local_28 + (ulong)local_3c);
    local_20 = local_30 & 0xffffffff;
    local_18 = puVar3;
    pcVar2 = digits2(local_20);
    *puVar3 = *(undefined2 *)pcVar2;
  }
  return (char *)(local_28 + (ulong)local_3c);
}

Assistant:

FMT_CONSTEXPR20 auto do_format_decimal(Char* out, UInt value, int size)
    -> Char* {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  unsigned n = to_unsigned(size);
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    n -= 2;
    write2digits(out + n, static_cast<unsigned>(value % 100));
    value /= 100;
  }
  if (value >= 10) {
    n -= 2;
    write2digits(out + n, static_cast<unsigned>(value));
  } else {
    out[--n] = static_cast<Char>('0' + value);
  }
  return out + n;
}